

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wire.cpp
# Opt level: O2

void __thiscall tiles::Wire::flip(Wire *this,Chunk *chunk,uint tileIndex,bool acrossVertical)

{
  TileData TVar1;
  
  Chunk::markTileDirty(chunk,tileIndex);
  TVar1 = chunk->tiles_[tileIndex];
  if (((uint)TVar1 & 0x1f) == 3) {
    if ((((uint)TVar1 >> 0xc & 1) == 0) != acrossVertical) {
      return;
    }
    TVar1 = (TileData)((uint)TVar1 ^ 0x2000);
  }
  else {
    if (((uint)TVar1 & 0x1f) != 2) {
      return;
    }
    if (acrossVertical) {
      TVar1 = (TileData)((uint)TVar1 ^ 0x3000);
    }
    else if (((uint)TVar1 >> 0xc & 1) == 0) {
      TVar1 = (TileData)((uint)TVar1 | 0x1000);
    }
    else {
      TVar1 = (TileData)((uint)TVar1 & 0xffffcfe2 | (int)TVar1 + 0x3000U & 0x2000);
    }
  }
  chunk->tiles_[tileIndex] = TVar1;
  return;
}

Assistant:

void Wire::flip(Chunk& chunk, unsigned int tileIndex, bool acrossVertical) {
    auto& tileData = modifyTileData(chunk, tileIndex);
    if (tileData.id == TileId::wireCorner) {
        if (acrossVertical) {
            tileData.dir = static_cast<Direction::t>(3 - tileData.dir);
        } else if (tileData.dir % 2 == 0) {
            tileData.dir = static_cast<Direction::t>(tileData.dir + 1);
        } else {
            tileData.dir = static_cast<Direction::t>(tileData.dir - 1);
        }
    } else if (tileData.id == TileId::wireTee && ((acrossVertical && tileData.dir % 2 == 0) || (!acrossVertical && tileData.dir % 2 == 1))) {
        tileData.dir = static_cast<Direction::t>((tileData.dir + 2) % 4);
    }
}